

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pragmaVtabNext(sqlite3_vtab_cursor *pVtabCursor)

{
  int iVar1;
  int local_1c;
  int rc;
  PragmaVtabCursor *pCsr;
  sqlite3_vtab_cursor *pVtabCursor_local;
  
  local_1c = 0;
  pVtabCursor[2].pVtab = (sqlite3_vtab *)((long)&(pVtabCursor[2].pVtab)->pModule + 1);
  iVar1 = sqlite3_step((sqlite3_stmt *)pVtabCursor[1].pVtab);
  if (iVar1 != 100) {
    local_1c = sqlite3_finalize((sqlite3_stmt *)pVtabCursor[1].pVtab);
    pVtabCursor[1].pVtab = (sqlite3_vtab *)0x0;
    pragmaVtabCursorClear((PragmaVtabCursor *)pVtabCursor);
  }
  return local_1c;
}

Assistant:

static int pragmaVtabNext(sqlite3_vtab_cursor *pVtabCursor){
  PragmaVtabCursor *pCsr = (PragmaVtabCursor*)pVtabCursor;
  int rc = SQLITE_OK;

  /* Increment the xRowid value */
  pCsr->iRowid++;
  assert( pCsr->pPragma );
  if( SQLITE_ROW!=sqlite3_step(pCsr->pPragma) ){
    rc = sqlite3_finalize(pCsr->pPragma);
    pCsr->pPragma = 0;
    pragmaVtabCursorClear(pCsr);
  }
  return rc;
}